

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall fasttext::ProductQuantizer::save(ProductQuantizer *this,ostream *out)

{
  float *pfVar1;
  char *in_RSI;
  long in_RDI;
  
  std::ostream::write(in_RSI,in_RDI + 0x1c);
  std::ostream::write(in_RSI,in_RDI + 0x20);
  std::ostream::write(in_RSI,in_RDI + 0x24);
  std::ostream::write(in_RSI,in_RDI + 0x28);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x1b7766);
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x30));
  std::ostream::write(in_RSI,(long)pfVar1);
  return;
}

Assistant:

void ProductQuantizer::save(std::ostream& out) const {
  out.write((char*)&dim_, sizeof(dim_));
  out.write((char*)&nsubq_, sizeof(nsubq_));
  out.write((char*)&dsub_, sizeof(dsub_));
  out.write((char*)&lastdsub_, sizeof(lastdsub_));
  out.write((char*)centroids_.data(), centroids_.size() * sizeof(real));
}